

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::
GeneratedMessageTest_TestSwapNameIsNotMangledForFields_Test::TestBody
          (GeneratedMessageTest_TestSwapNameIsNotMangledForFields_Test *this)

{
  undefined1 auStack_38 [48];
  
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesFields::
  TestConflictingSymbolNames_BadKnownNamesFields
            ((TestConflictingSymbolNames_BadKnownNamesFields *)auStack_38,(Arena *)0x0);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesFields::
  ~TestConflictingSymbolNames_BadKnownNamesFields
            ((TestConflictingSymbolNames_BadKnownNamesFields *)auStack_38);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  TestConflictingSymbolNames_BadKnownNamesValues
            ((TestConflictingSymbolNames_BadKnownNamesValues *)auStack_38,(Arena *)0x0);
  protobuf::internal::ExtensionSet::GetInt32
            ((ExtensionSet *)(auStack_38 + 0x10),
             proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::swap_,DAT_0197db14);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  ~TestConflictingSymbolNames_BadKnownNamesValues
            ((TestConflictingSymbolNames_BadKnownNamesValues *)auStack_38);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestSwapNameIsNotMangledForFields) {
  // For backwards compatibility we do not mangle `swap`. It works thanks to
  // overload resolution.
  int v [[maybe_unused]] =
      proto2_unittest::TestConflictingSymbolNames::BadKnownNamesFields().swap();

  // But we do mangle `swap` for extensions because there is no overloading
  // there.
  v = proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::TestConflictingSymbolNames::
                            BadKnownNamesValues::swap_);
}